

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemandDisk.cpp
# Opt level: O1

ssize_t __thiscall DemandDisk::read(DemandDisk *this,int __fd,void *__buf,size_t __nbytes)

{
  mutex *__mutex;
  _WordT *p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Track *this_00;
  Track *this_01;
  mapped_type *pmVar8;
  ssize_t sVar9;
  undefined8 uVar10;
  ulong __nbytes_00;
  undefined4 in_register_00000034;
  CylHead *this_02;
  TrackData trackdata;
  TrackData rescan_trackdata;
  pthread_mutex_t *local_1b0;
  TrackData local_1a0;
  undefined1 local_e8 [16];
  pointer local_d8;
  vector<Sector,_std::allocator<Sector>_> local_d0;
  pointer local_b0;
  pointer local_a0;
  pointer local_98;
  pointer local_88;
  pointer local_80;
  pointer local_70;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  
  this_02 = (CylHead *)CONCAT44(in_register_00000034,__fd);
  if ((int)__buf == 0) {
    iVar3 = CylHead::operator_cast_to_int(this_02);
    __nbytes_00 = (this->m_loaded).super__Base_bitset<4UL>._M_w[(ulong)(long)iVar3 >> 6];
    if ((__nbytes_00 >> ((long)iVar3 & 0x3fU) & 1) != 0) goto LAB_00153a3e;
  }
  (*(this->super_Disk)._vptr_Disk[7])(&local_1a0,this,this_02,1);
  this_00 = TrackData::track(&local_1a0);
  iVar4 = (*(this->super_Disk)._vptr_Disk[6])(this);
  iVar3 = 0;
  if ((char)iVar4 == '\0') {
    iVar3 = opt.retries;
  }
  if ((0 < opt.rescans) || (0 < iVar3)) {
    iVar4 = opt.rescans;
    do {
      if (iVar4 < 1) {
        bVar2 = Track::has_good_data(this_00);
        if (bVar2) break;
      }
      (*(this->super_Disk)._vptr_Disk[7])((TrackData *)local_e8,this,this_02,0);
      this_01 = TrackData::track((TrackData *)local_e8);
      iVar5 = Track::size(this_01);
      iVar6 = Track::size(this_00);
      if (iVar6 < iVar5) {
        std::swap<TrackData>(&local_1a0,(TrackData *)local_e8);
      }
      bVar2 = TrackData::has_flux(&local_1a0);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_50);
      if (local_80 != (pointer)0x0) {
        operator_delete(local_80,(long)local_70 - (long)local_80);
      }
      if (local_98 != (pointer)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      if (local_b0 != (pointer)0x0) {
        operator_delete(local_b0,(long)local_a0 - (long)local_b0);
      }
      iVar5 = (uint)bVar2 * 4 + 1;
      iVar4 = iVar4 - iVar5;
      iVar3 = iVar3 - iVar5;
      std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_d0);
    } while ((0 < iVar4) || (0 < iVar3));
  }
  __mutex = &(this->super_Disk).m_trackdata_mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar10 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock(local_1b0);
    TrackData::~TrackData(&local_1a0);
    _Unwind_Resume(uVar10);
  }
  pmVar8 = std::
           map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
           ::operator[](&(this->super_Disk).m_trackdata,this_02);
  pmVar8->cylhead = local_1a0.cylhead;
  pmVar8->m_type = local_1a0.m_type;
  pmVar8->m_flags = local_1a0.m_flags;
  (pmVar8->m_track).tracklen = local_1a0.m_track.tracklen;
  (pmVar8->m_track).tracktime = local_1a0.m_track.tracktime;
  local_e8._0_8_ =
       (pmVar8->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (pmVar8->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8 = (pmVar8->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  (pmVar8->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1a0.m_track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pmVar8->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1a0.m_track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pmVar8->m_track).m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1a0.m_track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1a0.m_track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.m_track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.m_track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Sector,_std::allocator<Sector>_>::~vector
            ((vector<Sector,_std::allocator<Sector>_> *)local_e8);
  (pmVar8->m_bitstream).datarate = local_1a0.m_bitstream.datarate;
  (pmVar8->m_bitstream).encoding = local_1a0.m_bitstream.encoding;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(pmVar8->m_bitstream).m_data,&local_1a0.m_bitstream.m_data);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(pmVar8->m_bitstream).m_indexes,&local_1a0.m_bitstream.m_indexes);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(pmVar8->m_bitstream).m_sync_losses,&local_1a0.m_bitstream.m_sync_losses);
  (pmVar8->m_bitstream).m_wrapped = local_1a0.m_bitstream.m_wrapped;
  (pmVar8->m_bitstream).m_bitsize = local_1a0.m_bitstream.m_bitsize;
  (pmVar8->m_bitstream).m_bitpos = local_1a0.m_bitstream.m_bitpos;
  (pmVar8->m_bitstream).m_splicepos = local_1a0.m_bitstream.m_splicepos;
  (pmVar8->m_bitstream).m_next_index = local_1a0.m_bitstream.m_next_index;
  local_e8._0_8_ =
       (pmVar8->m_flux).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (pmVar8->m_flux).
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8 = (pointer)(pmVar8->m_flux).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar8->m_flux).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1a0.m_flux.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pmVar8->m_flux).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1a0.m_flux.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pmVar8->m_flux).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1a0.m_flux.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1a0.m_flux.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.m_flux.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.m_flux.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_e8);
  pmVar8->m_normalised_flux = local_1a0.m_normalised_flux;
  uVar7 = CylHead::operator_cast_to_int(this_02);
  __nbytes_00 = (ulong)uVar7;
  p_Var1 = (this->m_loaded).super__Base_bitset<4UL>._M_w + ((ulong)(long)(int)uVar7 >> 6);
  *p_Var1 = *p_Var1 | 1L << ((byte)uVar7 & 0x3f);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_1a0.m_flux);
  if (local_1a0.m_bitstream.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.m_bitstream.m_sync_losses.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_1a0.m_bitstream.m_sync_losses.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_1a0.m_bitstream.m_sync_losses.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_1a0.m_bitstream.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.m_bitstream.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.m_bitstream.m_indexes.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.m_bitstream.m_indexes.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a0.m_bitstream.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.m_bitstream.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.m_bitstream.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.m_bitstream.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_1a0.m_track.m_sectors);
LAB_00153a3e:
  sVar9 = Disk::read(&this->super_Disk,__fd,(void *)0x0,__nbytes_00);
  return sVar9;
}

Assistant:

const TrackData& DemandDisk::read(const CylHead& cylhead, bool uncached)
{
    if (uncached || !m_loaded[cylhead])
    {
        // Quick first read, plus sector-based conversion
        auto trackdata = load(cylhead, true);
        auto& track = trackdata.track();

        // If the disk supports sector-level retries we won't duplicate them.
        auto retries = supports_retries() ? 0 : opt.retries;
        auto rescans = opt.rescans;

        // Consider rescans and error retries.
        while (rescans > 0 || retries > 0)
        {
            // If no more rescans are required, stop when there's nothing to fix.
            if (rescans <= 0 && track.has_good_data())
                break;

            auto rescan_trackdata = load(cylhead);
            auto& rescan_track = rescan_trackdata.track();

            // If the rescan found more sectors, use the new track data.
            if (rescan_track.size() > track.size())
                std::swap(trackdata, rescan_trackdata);

            // Flux reads include 5 revolutions, others just 1
            auto revs = trackdata.has_flux() ? REMAIN_READ_REVS : 1;
            rescans -= revs;
            retries -= revs;
        }

        std::lock_guard<std::mutex> lock(m_trackdata_mutex);
        m_trackdata[cylhead] = std::move(trackdata);
        m_loaded[cylhead] = true;
    }

    return Disk::read(cylhead);
}